

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O2

void __thiscall QTreeWidgetItem::setFirstColumnSpanned(QTreeWidgetItem *this,bool span)

{
  QTreeView *this_00;
  int row;
  QTreeModel *__s;
  long in_FS_OFFSET;
  QModelIndex local_60;
  undefined1 *local_48;
  undefined1 *puStack_40;
  QTreeWidgetItem *local_38;
  QTreeWidgetItem *local_30;
  
  local_30 = *(QTreeWidgetItem **)(in_FS_OFFSET + 0x28);
  __s = treeModel(this,(QTreeWidget *)0x0);
  if ((__s != (QTreeModel *)0x0) && (__s->headerItem != this)) {
    local_38 = (QTreeWidgetItem *)&DAT_aaaaaaaaaaaaaaaa;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    QTreeModel::index((QTreeModel *)&local_48,(char *)__s,(int)this);
    this_00 = &this->view->super_QTreeView;
    row = (int)local_48;
    QModelIndex::parent(&local_60,(QModelIndex *)&local_48);
    QTreeView::setFirstColumnSpanned(this_00,row,&local_60,span);
  }
  if (*(QTreeWidgetItem **)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeWidgetItem::setFirstColumnSpanned(bool span)
{
    const QTreeModel *model = treeModel();
    if (!model || this == model->headerItem)
        return; // We can't set the header items to spanning
    const QModelIndex index = model->index(this, 0);
    view->setFirstColumnSpanned(index.row(), index.parent(), span);
}